

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSGetLastMassFlag(void *arkode_mem,long *flag)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSGetLastMassFlag",&local_10,&local_18);
  if (iVar1 == 0) {
    *flag = (long)local_18->last_flag;
  }
  return iVar1;
}

Assistant:

int arkLSGetLastMassFlag(void *arkode_mem, long int *flag)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetLastMassFlag",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *flag = arkls_mem->last_flag;
  return(ARKLS_SUCCESS);
}